

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_postfix_expr(gvisitor_t *self,gnode_postfix_expr_t *node)

{
  _Bool _Var1;
  gnode_n gVar2;
  ulong *puVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  int iVar9;
  gnode_t *pgVar10;
  gnode_r *pgVar11;
  gnode_t *pgVar12;
  char *pcVar13;
  gnode_binary_expr_t *expr;
  gnode_postfix_expr_t *node_00;
  gnode_postfix_expr_t *pgVar14;
  ulong uVar15;
  gnode_postfix_subexpr_t *pgVar16;
  ulong uVar17;
  bool bVar18;
  
  if (node->id == (gnode_t *)0x0) {
    pcVar13 = "Invalid postfix expression.";
    node_00 = node;
LAB_0011ea9d:
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node_00->base,pcVar13);
    return;
  }
  gvisit(self,node->id);
  node_00 = (gnode_postfix_expr_t *)node->id;
  if (node_00 != (gnode_postfix_expr_t *)0x0) {
    gVar2 = (node_00->base).tag;
    if (gVar2 == NODE_IDENTIFIER_EXPR) {
      pgVar12 = *(gnode_t **)&node_00[1].base;
      if ((pgVar12 != (gnode_t *)0x0) && (pgVar12->tag == NODE_ENUM_DECL)) {
        if (node->list->n == 0) {
          pgVar14 = (gnode_postfix_expr_t *)0x0;
        }
        else {
          pgVar14 = (gnode_postfix_expr_t *)*node->list->p;
        }
        if ((pgVar14->base).tag == NODE_ACCESS_EXPR) {
          if ((node->base).is_assignment == true) {
            pcVar13 = "Assignment not allowed for an enum type.";
            node_00 = node;
          }
          else {
            pgVar10 = pgVar14->id;
            if ((pgVar10 != (gnode_t *)0x0) && (pgVar10->tag == NODE_IDENTIFIER_EXPR)) {
              pcVar13 = *(char **)(pgVar10 + 1);
              pgVar10 = lookup_node(pgVar12,pcVar13);
              if (pgVar10 == (gnode_t *)0x0) {
                uVar8._0_4_ = pgVar12[1].token.colno;
                uVar8._4_4_ = pgVar12[1].token.position;
                report_error(self,GRAVITY_ERROR_SEMANTIC,&pgVar14->base,
                             "Unable to find %s in enum %s.",pcVar13,uVar8);
                return;
              }
              if ((node->list != (gnode_r *)0x0) && (node->list->n == 1)) {
                gnode_free(node->id);
                if (node->list->n == 0) {
                  pgVar16 = (gnode_postfix_subexpr_t *)0x0;
                }
                else {
                  pgVar16 = (gnode_postfix_subexpr_t *)*node->list->p;
                }
                free_postfix_subexpr(pgVar16);
                pgVar11 = node->list;
                if (pgVar11->p != (gnode_t **)0x0) {
                  free(pgVar11->p);
                  pgVar11 = node->list;
                }
                free(pgVar11);
                node->list = (gnode_r *)0x0;
                pgVar12 = gnode_duplicate(pgVar10,false);
                node->id = pgVar12;
                return;
              }
              gnode_free(node->id);
              pgVar16 = (gnode_postfix_subexpr_t *)0x0;
              pgVar12 = gnode_duplicate(pgVar10,false);
              node->id = pgVar12;
              if (node->list->n != 0) {
                pgVar16 = (gnode_postfix_subexpr_t *)*node->list->p;
              }
              free_postfix_subexpr(pgVar16);
              pgVar11 = gnode_array_remove_byindex(node->list,0);
              node->list = pgVar11;
              return;
            }
            pcVar13 = "Invalid enum expression.";
            node_00 = pgVar14;
          }
        }
        else {
          pcVar13 = "Invalid enum expression.";
        }
        goto LAB_0011ea9d;
      }
      puVar3 = *self->data;
      if ((puVar3 != (ulong *)0x0) && (uVar4 = *puVar3, 1 < uVar4)) {
        uVar15 = puVar3[2];
        piVar5 = *(int **)((uVar15 - 8) + uVar4 * 8);
        if ((piVar5 != (int *)0x0) && ((*piVar5 == 8 && (*(char **)(piVar5 + 0x18) != (char *)0x0)))
           ) {
          pgVar11 = node->list;
          iVar9 = strcmp(*(char **)(piVar5 + 0x18),"init");
          if ((iVar9 == 0) &&
             ((pgVar10 = *(gnode_t **)((uVar15 - 0x10) + uVar4 * 8), pgVar10 != (gnode_t *)0x0 &&
              (pgVar10->tag == NODE_CLASS_DECL)))) {
            if (pgVar12 == (gnode_t *)0x0) {
              if (node_00->id == (gnode_t *)0x0) goto LAB_0011eb05;
              iVar9 = strcmp((char *)node_00->id,"self");
              bVar18 = iVar9 == 0;
            }
            else {
              bVar18 = pgVar10 == pgVar12;
            }
            if ((((pgVar11 != (gnode_r *)0x0) && (bVar18)) && (pgVar11->n != 0)) &&
               ((*pgVar11->p)->tag == NODE_CALL_EXPR)) {
              bVar18 = false;
              report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                           "Infinite loop detected in init func.");
              node_00 = (gnode_postfix_expr_t *)node->id;
              if (node_00 == (gnode_postfix_expr_t *)0x0) goto LAB_0011eb23;
            }
          }
        }
      }
LAB_0011eb05:
      gVar2 = (node_00->base).tag;
    }
    if (gVar2 == NODE_KEYWORD_EXPR) {
      bVar18 = (node_00->base).token.type == TOK_KEY_SUPER;
      goto LAB_0011eb23;
    }
  }
  bVar18 = false;
LAB_0011eb23:
  if ((node->list != (gnode_r *)0x0) && (uVar4 = node->list->n, uVar4 != 0)) {
    _Var1 = (node->base).is_assignment;
    uVar15 = 0;
    do {
      if (uVar15 < node->list->n) {
        node_00 = (gnode_postfix_expr_t *)node->list->p[uVar15];
      }
      else {
        node_00 = (gnode_postfix_expr_t *)0x0;
      }
      gVar2 = (node_00->base).tag;
      uVar15 = uVar15 + 1;
      if ((uVar15 == uVar4) && (_Var1 != false)) {
        if (gVar2 == NODE_CALL_EXPR) {
          pcVar13 = "Unable to assign a value to a function call.";
          goto LAB_0011ea9d;
        }
        if (bVar18) {
          pcVar13 = "Unable to explicitly modify super.";
          goto LAB_0011ea9d;
        }
      }
      if (gVar2 == NODE_ACCESS_EXPR) {
        pgVar12 = node_00->id;
        if ((pgVar12 == (gnode_t *)0x0) || (pgVar12->tag != NODE_IDENTIFIER_EXPR)) {
          report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar12,"Invalid access expression.");
        }
      }
      else if (gVar2 == NODE_SUBSCRIPT_EXPR) {
        if (node_00->id != (gnode_t *)0x0) {
          gvisit(self,node_00->id);
        }
      }
      else {
        if (gVar2 != NODE_CALL_EXPR) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_semacheck2.c"
                        ,0x473,"void visit_postfix_expr(gvisitor_t *, gnode_postfix_expr_t *)");
        }
        pgVar12 = node_00->id;
        if ((pgVar12 != (gnode_t *)0x0) &&
           (uVar6._0_4_ = pgVar12->tag, uVar6._4_4_ = pgVar12->refcount, uVar6 != 0)) {
          uVar17 = 0;
          do {
            pgVar12 = node_00->id;
            uVar7._0_4_ = pgVar12->tag;
            uVar7._4_4_ = pgVar12->refcount;
            if ((uVar17 < uVar7) &&
               (pgVar14 = *(gnode_postfix_expr_t **)(*(long *)&pgVar12->token + uVar17 * 8),
               pgVar14 != (gnode_postfix_expr_t *)0x0)) {
              if (((pgVar14->base).tag == NODE_BINARY_EXPR) && (*(int *)&pgVar14->id == 0x45)) {
                pcVar13 = 
                "Assignment does not have side effects and so cannot be used as function argument.";
                node_00 = pgVar14;
                goto LAB_0011ea9d;
              }
            }
            else {
              pgVar14 = (gnode_postfix_expr_t *)0x0;
            }
            gvisit(self,&pgVar14->base);
            uVar17 = uVar17 + 1;
          } while (uVar6 != uVar17);
        }
      }
    } while (uVar15 != uVar4);
  }
  return;
}

Assistant:

static void visit_postfix_expr (gvisitor_t *self, gnode_postfix_expr_t *node) {
    DEBUG_CODEGEN("visit_postfix_expr");

    // node->list usually cannot be NULL, it is NULL only as a result of a static enum transformation (see semacheck2.c)
    if (node->list == NULL) {
        visit(node->id);
        return;
    }

    DECLARE_CODE();
    CODEGEN_COUNT_REGISTERS(n1);
    ircode_push_context(code);

    // disable MOVE optimization
	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));

    // generate code for the common id node
    visit(node->id);

    bool is_super = IS_SUPER(node->id);

    // register that contains callable object
    uint32_t target_register = ircode_register_pop_context_protect(code, true);
    if (target_register == REGISTER_ERROR) {
        report_error(self, (gnode_t *)node->id, "Invalid postfix expression.");
        return;
    }

    // register where to store final result
    uint32_t dest_register = target_register;

    // mandatory self register (initialized to 0 in case of implicit self or explicit super)
    uint32_r self_list; marray_init(self_list);
    uint32_t first_self_register = compute_self_register(self, code, node->id, target_register, node->list);
    if (first_self_register == UINT32_MAX) return;
    marray_push(uint32_t, self_list, first_self_register);

    // process each subnode and set is_assignment flag
    bool is_assignment = node->base.is_assignment;
    size_t count = gnode_array_size(node->list);

    for (size_t i=0; i<count; ++i) {
        // a subnode can be a CALL_EXPR     => id.()
        // a NODE_ACCESS_EXPR               => id.id2
        // a NODE_SUBSCRIPT_EXPR            => id[]
        // or ANY combination of the them!  => id.id2.id3()[24]().id5()
        gnode_postfix_subexpr_t *subnode = (gnode_postfix_subexpr_t *)gnode_array_get(node->list, i);

        // identify postfix type: NODE_CALL_EXPR, NODE_ACCESS_EXPR, NODE_SUBSCRIPT_EXPR
        gnode_n tag = subnode->base.tag;

        // check assignment flag
        bool is_real_assigment = (is_assignment && IS_LAST_LOOP(i, count));

        if (tag == NODE_CALL_EXPR) {
            // a CALL instruction needs to properly prepare stack before execution
            // format is CALL A B C

            // where A is the destination register
            // B is the callable object
            // and C is the number of arguments passed to the CALL
            // arguments must be on the stack (so gravity VM can use a register window in order to speed up instruction)
            // and are expected to be starting from B+1

            // check dest register
            bool dest_is_temp = ircode_register_istemp(code, dest_register);
            if (!dest_is_temp) {
                dest_register = ircode_register_push_temp(code);
                dest_is_temp = true;
            }

            // add target register (must be temp)
            uint32_t temp_target_register = ircode_register_push_temp(code);
			ircode_add(code, MOVE, temp_target_register, target_register, 0, LINE_NUMBER(node));
            uint32_t treg = ircode_register_pop_context_protect(code, true);
            if (treg == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode, "Unexpected register error.");
                return;
            }

            // always add SELF parameter (must be temp+1)
            uint32_t self_register = marray_pop(self_list);
            uint32_t temp_self_register = ircode_register_push_temp(code);
			ircode_add(code, MOVE, temp_self_register, self_register, 0, LINE_NUMBER(node));
            treg = ircode_register_pop_context_protect(code, true);
            if (treg == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode, "Unexpected register error.");
                return;
            }

            // process each parameter (each must be temp+2 ... temp+n)
            marray_decl_init(uint32_r, args);
            size_t n = gnode_array_size(subnode->args);
            for (size_t j=0; j<n; ++j) {
                // process each argument
                gnode_t *arg = (gnode_t *)gnode_array_get(subnode->args, j);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
                visit(arg);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
                uint32_t nreg = ircode_register_pop_context_protect(code, true);
                if (nreg == REGISTER_ERROR) {
                    report_error(self, (gnode_t *)arg, "Invalid argument expression at index %d.", j+1);
                    return;
                }

                // make sure args are in consecutive register locations (from temp_target_register + 1 to temp_target_register + n)
                if (nreg != temp_target_register + j + 2) {
                    uint32_t temp = ircode_register_push_temp(code);
                    if (temp == 0) return; // temp value == 0 means codegen error (error will be automatically reported later in visit_function_decl
					ircode_add(code, MOVE, temp, nreg, 0, LINE_NUMBER(node));
                    ircode_register_clear(code, nreg);
                    nreg = ircode_register_pop_context_protect(code, true);
                    if (nreg == REGISTER_ERROR) {
                        report_error(self, (gnode_t *)arg, "Invalid argument expression");
                        return;
                    }
                }
                if (nreg != temp_target_register + j + 2) {
                    report_error(self, (gnode_t *)arg, "Invalid register computation in call expression.");
                    return;
                }
                
                // a checkpoint should be added after each nreg computation in order to support STRUCT
                // I'll skip this overhead in this version because it should be a type based decision
                // ircode_add_check(code, nreg);
                marray_push(uint32_t, args, nreg);
            }

            // generate instruction CALL with count parameters (taking in account self)
			ircode_add(code, CALL, dest_register, temp_target_register, (uint32_t)n+1, LINE_NUMBER(node));

            // cleanup temp registers
            ircode_register_clear(code, temp_target_register);
            ircode_register_clear(code, temp_self_register);
            n = gnode_array_size(subnode->args);
            for (size_t j=0; j<n; ++j) {
                uint32_t reg = marray_get(args, j);
                ircode_register_clear(code, reg);
            }

            // update self list
            marray_push(uint32_t, self_list, dest_register);

            // a call returns a value
            if (IS_LAST_LOOP(i, count)) {
                if (ircode_register_count(code)) {
                    // code added in order to protect the extra register pushed in case
                    // of code like: f(20)(30)
                    uint32_t last_register = ircode_register_last(code);
                    if (last_register == REGISTER_ERROR) {
                        report_error(self, (gnode_t *)subnode, "Invalid call expression.");
                        return;
                    }
                    if (dest_is_temp && last_register == dest_register) dest_is_temp = false;
                }
                if (dest_is_temp) ircode_register_push(code, dest_register);
                if (!ircode_register_protect_outside_context(code, dest_register)) {
                    report_error(self, (gnode_t *)subnode, "Invalid register access.");
                    return;
                }
            }

            // free temp args array
            marray_destroy(args);

        } else if (tag == NODE_ACCESS_EXPR) {
            // process identifier node (semantic check assures that each node is an identifier)
            gnode_identifier_expr_t *expr = (gnode_identifier_expr_t *)subnode->expr;
            uint32_t index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, expr->value));
            uint32_t index_register = ircode_register_push_temp(code);
			ircode_add(code, LOADK, index_register, index, 0, LINE_NUMBER(expr));
            uint32_t temp = ircode_register_pop(code);
            if (temp == REGISTER_ERROR) {
                report_error(self, (gnode_t *)expr, "Invalid access expression.");
                return;
            }

            // generate LOAD/STORE instruction
            dest_register = (is_real_assigment) ? ircode_register_pop(code) : ircode_register_push_temp(code);
            if (dest_register == REGISTER_ERROR) {
                report_error(self, (gnode_t *)expr, "Invalid access expression.");
                return;
            }

            if (is_super) {
                gravity_class_t *class = context_get_class(self);
                if (!class) {
                    report_error(self, (gnode_t *)node, "Unable to use super keyword in a non class context.");
                    return;
                }
                
                // check if class has a superclass not yet processed
                const char *identifier = lookup_superclass_identifier (self, class);
                if (!identifier) {
                    // it means that class superclass has already been processed
                    class = class->superclass;
                    identifier = (class) ? class->identifier : GRAVITY_CLASS_OBJECT_NAME;
                }
                
                uint32_t cpool_index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));
                ircode_add_constant(code, cpool_index, LINE_NUMBER(node));
                uint32_t temp_reg = ircode_register_pop(code);
                ircode_add(code, LOADS, dest_register, temp_reg, index_register, LINE_NUMBER(node));
            } else {
                ircode_add(code, (is_real_assigment) ? STORE : LOAD, dest_register, target_register, index_register, LINE_NUMBER(node));
            }
            
            if (!is_real_assigment) {
                if (i+1<count) {
                uint32_t rtemp = ircode_register_pop_context_protect(code, true);
                if (rtemp == REGISTER_ERROR) {
                    report_error(self, (gnode_t *)expr, "Unexpected register error.");
                    return;
                }
                } else {
                    // last loop
                    if (ircode_register_istemp(code, dest_register))
                        ircode_register_protect_outside_context(code, dest_register);
                }
            }

            // update self list (if latest instruction)
            // this was added in order to properly emit instructions for nested_class.gravity unit test
            if (!IS_LAST_LOOP(i, count)) {
                gnode_postfix_subexpr_t *nextnode = (gnode_postfix_subexpr_t *)gnode_array_get(node->list, i+1);
                if (nextnode->base.tag != NODE_CALL_EXPR) marray_push(uint32_t, self_list, dest_register);
            }

        } else if (tag == NODE_SUBSCRIPT_EXPR) {
            // process index
			ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
            visit(subnode->expr);
			ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
            uint32_t index = ircode_register_pop(code);
            if (index == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode->expr, "Invalid subscript expression.");
                return;
            }

            // generate LOADAT/STOREAT instruction
            dest_register = (is_real_assigment) ? ircode_register_pop(code) : ircode_register_push_temp(code);
            if (dest_register == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode->expr, "Invalid subscript expression.");
                return;
            }
			ircode_add(code, (is_real_assigment) ? STOREAT : LOADAT, dest_register, target_register, index, LINE_NUMBER(node));
            if ((!is_real_assigment) && (i+1<count)) {
                uint32_t rtemp = ircode_register_pop_context_protect(code, true);
                if (rtemp == REGISTER_ERROR) {
                    report_error(self, (gnode_t *)subnode->expr, "Unexpected register error.");
                    return;
                }
                marray_push(uint32_t, self_list, rtemp);
            }
        }

        // reset is_super flag
        is_super = false;

        // update target
        target_register = dest_register;
    }

    marray_destroy(self_list);
    ircode_pop_context(code);

    // temp fix for not optimal register allocation algorithm generated code
    uint32_t temp_register = ircode_register_first_temp_available(code);
    if (temp_register < dest_register) {
        // free dest register
        ircode_register_pop(code);
        // allocate a new register (that I am now sure does not have holes)
        temp_register = ircode_register_push_temp(code);
        ircode_add(code, MOVE, temp_register, dest_register, 0, LINE_NUMBER(node));
        ircode_register_clear(code, dest_register);
    }
    
    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, (is_assignment) ? -1 : 1);

    // re-enable MOVE optimization
	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
}